

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O2

Node * __thiscall
QTriangulator<unsigned_short>::SimpleToMonotone::searchEdgeLeftOfEdge
          (SimpleToMonotone *this,int edgeIndex)

{
  Node *pNVar1;
  bool bVar2;
  QRBTree<int> *pQVar3;
  Node *pNVar4;
  
  pQVar3 = &this->m_edgeList;
  pNVar4 = (Node *)0x0;
  while (pNVar1 = pQVar3->root, pNVar1 != (Node *)0x0) {
    bVar2 = edgeIsLeftOfEdge(this,edgeIndex,pNVar1->data);
    pQVar3 = (QRBTree<int> *)(&pNVar1->left + !bVar2);
    if (!bVar2) {
      pNVar4 = pNVar1;
    }
  }
  return pNVar4;
}

Assistant:

QRBTree<int>::Node *QTriangulator<T>::SimpleToMonotone::searchEdgeLeftOfEdge(int edgeIndex) const
{
    QRBTree<int>::Node *current = m_edgeList.root;
    QRBTree<int>::Node *result = nullptr;
    while (current) {
        if (edgeIsLeftOfEdge(edgeIndex, current->data)) {
            current = current->left;
        } else {
            result = current;
            current = current->right;
        }
    }
    return result;
}